

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O1

int4 __thiscall
RuleOrPredicate::checkSingle
          (RuleOrPredicate *this,Varnode *vn,MultiPredicate *branch,PcodeOp *op,Funcdata *data)

{
  pointer pBVar1;
  BlockBasic *pBVar2;
  bool bVar3;
  PcodeOp *pPVar4;
  int4 iVar5;
  int4 iVar6;
  
  iVar5 = 0;
  iVar6 = 0;
  if ((vn->flags & 0x18) != 0) {
    bVar3 = MultiPredicate::discoverCbranch(branch);
    iVar6 = iVar5;
    if (bVar3) {
      pPVar4 = Varnode::loneDescend(branch->op->output);
      if (pPVar4 == op) {
        pBVar1 = (branch->condBlock->outofthis).
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar2 = (BlockBasic *)pBVar1[1].point;
        if (pBVar2 == (BlockBasic *)branch->zeroBlock) {
          branch->zeroPathIsTrue = true;
        }
        else if ((BlockBasic *)pBVar1->point == (BlockBasic *)branch->zeroBlock) {
          branch->zeroPathIsTrue = false;
        }
        else {
          branch->zeroPathIsTrue = pBVar2 == branch->op->parent;
        }
        bVar3 = MultiPredicate::discoverConditionalZero(branch,vn);
        if ((bVar3) && (branch->zeroPathIsTrue == false)) {
          Funcdata::opSetInput(data,branch->op,vn,branch->zeroSlot);
          iVar6 = 1;
          Funcdata::opRemoveInput(data,op,1);
          Funcdata::opSetOpcode(data,op,CPUI_COPY);
          Funcdata::opSetInput(data,op,branch->op->output,0);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int4 RuleOrPredicate::checkSingle(Varnode *vn,MultiPredicate &branch,PcodeOp *op,Funcdata &data)

{
  if (vn->isFree()) return 0;
  if (!branch.discoverCbranch()) return 0;
  if (branch.op->getOut()->loneDescend() != op) return 0;	// Must only be one use of MULTIEQUAL, because we rewrite it
  branch.discoverPathIsTrue();
  if (!branch.discoverConditionalZero(vn)) return 0;
  if (branch.zeroPathIsTrue) return 0;		// true condition (vn == 0) must not go to zero set
  data.opSetInput(branch.op,vn,branch.zeroSlot);
  data.opRemoveInput(op,1);
  data.opSetOpcode(op,CPUI_COPY);
  data.opSetInput(op,branch.op->getOut(),0);
  return 1;
}